

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<int,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  int iVar1;
  data_ptr_t pdVar2;
  undefined1 auVar3 [16];
  RLEScanState<int> *scan_state;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int *data_pointer;
  rle_count_t *index_pointer;
  ulong uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  
  scan_state = (RLEScanState<int> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (int *)(pdVar2 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<int>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar13 = _DAT_01da0bd0;
  auVar3 = _DAT_01d9fb10;
  auVar12 = _DAT_01d9fb00;
  uVar10 = scan_count + result_offset;
  if (result_offset < uVar10) {
    iVar5 = scan_state->entry_pos;
    iVar4 = scan_state->position_in_entry;
    do {
      uVar9 = index_pointer[iVar5] - iVar4;
      uVar8 = uVar10 - result_offset;
      iVar1 = data_pointer[iVar5];
      if (uVar8 < uVar9) {
        if (uVar10 != result_offset) {
          lVar6 = uVar8 + (uVar8 == 0);
          lVar7 = lVar6 + -1;
          auVar18._8_4_ = (int)lVar7;
          auVar18._0_8_ = lVar7;
          auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar10 = 0;
          auVar18 = auVar18 ^ auVar3;
          auVar12 = _DAT_01da0bd0;
          auVar13 = _DAT_01d9fb00;
          do {
            auVar15 = auVar13 ^ auVar3;
            iVar11 = auVar18._4_4_;
            if ((bool)(~(auVar15._4_4_ == iVar11 && auVar18._0_4_ < auVar15._0_4_ ||
                        iVar11 < auVar15._4_4_) & 1)) {
              *(int *)(pdVar2 + uVar10 * 4 + result_offset * 4) = iVar1;
            }
            if ((auVar15._12_4_ != auVar18._12_4_ || auVar15._8_4_ <= auVar18._8_4_) &&
                auVar15._12_4_ <= auVar18._12_4_) {
              *(int *)(pdVar2 + uVar10 * 4 + result_offset * 4 + 4) = iVar1;
            }
            iVar17 = SUB164(auVar12 ^ auVar3,4);
            if (iVar17 <= iVar11 &&
                (iVar17 != iVar11 || SUB164(auVar12 ^ auVar3,0) <= auVar18._0_4_)) {
              *(int *)(pdVar2 + uVar10 * 4 + result_offset * 4 + 8) = iVar1;
              *(int *)(pdVar2 + uVar10 * 4 + result_offset * 4 + 0xc) = iVar1;
            }
            uVar10 = uVar10 + 4;
            lVar7 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 4;
            auVar13._8_8_ = lVar7 + 4;
            lVar7 = auVar12._8_8_;
            auVar12._0_8_ = auVar12._0_8_ + 4;
            auVar12._8_8_ = lVar7 + 4;
          } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar10);
        }
        scan_state->position_in_entry = iVar4 + uVar8;
        return;
      }
      if (index_pointer[iVar5] != iVar4) {
        lVar6 = uVar9 - 1;
        auVar14._8_4_ = (int)lVar6;
        auVar14._0_8_ = lVar6;
        auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = result_offset * 4;
        auVar14 = auVar14 ^ auVar3;
        uVar8 = 0;
        auVar15 = auVar12;
        auVar16 = auVar13;
        do {
          auVar18 = auVar15 ^ auVar3;
          iVar11 = auVar14._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar11 && auVar14._0_4_ < auVar18._0_4_ ||
                      iVar11 < auVar18._4_4_) & 1)) {
            *(int *)(pdVar2 + uVar8 * 4 + lVar6) = iVar1;
          }
          if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
              auVar18._12_4_ <= auVar14._12_4_) {
            *(int *)(pdVar2 + uVar8 * 4 + lVar6 + 4) = iVar1;
          }
          iVar17 = SUB164(auVar16 ^ auVar3,4);
          if (iVar17 <= iVar11 && (iVar17 != iVar11 || SUB164(auVar16 ^ auVar3,0) <= auVar14._0_4_))
          {
            *(int *)(pdVar2 + uVar8 * 4 + lVar6 + 8) = iVar1;
            *(int *)(pdVar2 + uVar8 * 4 + lVar6 + 0xc) = iVar1;
          }
          uVar8 = uVar8 + 4;
          lVar7 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 4;
          auVar15._8_8_ = lVar7 + 4;
          lVar7 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar7 + 4;
        } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar8);
      }
      result_offset = result_offset + uVar9;
      iVar5 = iVar5 + 1;
      scan_state->entry_pos = iVar5;
      scan_state->position_in_entry = 0;
      iVar4 = 0;
    } while (result_offset < uVar10);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}